

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alternate_shared_mutex.hpp
# Opt level: O2

void __thiscall
yamc::alternate::detail::shared_mutex_base<yamc::rwlock::WriterPrefer>::lock_shared
          (shared_mutex_base<yamc::rwlock::WriterPrefer> *this)

{
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> uStack_28;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->mtx_);
  while ((this->state_).nwriter != 0) {
    std::condition_variable::wait((unique_lock *)&this->cv_);
  }
  rwlock::WriterPrefer::acquire_rlock(&this->state_);
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  return;
}

Assistant:

void lock_shared()
  {
    std::unique_lock<decltype(mtx_)> lk(mtx_);
    while (RwLockPolicy::wait_rlock(state_)) {
      cv_.wait(lk);
    }
    RwLockPolicy::acquire_rlock(state_);
  }